

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O0

bool flow::transform::rewriteBrToExit(IRHandler *handler)

{
  BrInstr *this;
  bool bVar1;
  TerminateInstr *pTVar2;
  size_t sVar3;
  long *local_a0;
  BasicBlock *local_90;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_70;
  undefined1 local_68 [16];
  RetInstr *ret;
  BasicBlock *targetBB;
  BrInstr *br;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  IRHandler *handler_local;
  
  ___begin2 = IRHandler::basicBlocks_abi_cxx11_(handler);
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                    *)&__begin2);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              *)&__begin2);
  do {
    bVar1 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar1) {
      return false;
    }
    br = (BrInstr *)
         util::
         UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
         ::iterator::operator*(&__end2);
    pTVar2 = BasicBlock::getTerminator((BasicBlock *)br);
    if (pTVar2 == (TerminateInstr *)0x0) {
      local_90 = (BasicBlock *)0x0;
    }
    else {
      local_90 = (BasicBlock *)__dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0)
      ;
    }
    targetBB = local_90;
    if (local_90 != (BasicBlock *)0x0) {
      ret = (RetInstr *)BrInstr::targetBlock((BrInstr *)local_90);
      sVar3 = BasicBlock::size((BasicBlock *)ret);
      if (sVar3 != 1) {
        return false;
      }
      bVar1 = BasicBlock::isAfter((BasicBlock *)br,(BasicBlock *)ret);
      if (bVar1) {
        return false;
      }
      pTVar2 = BasicBlock::getTerminator((BasicBlock *)ret);
      if (pTVar2 == (TerminateInstr *)0x0) {
        local_a0 = (long *)0x0;
      }
      else {
        local_a0 = (long *)__dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&RetInstr::typeinfo,0);
      }
      local_68._8_8_ = local_a0;
      if (local_a0 != (long *)0x0) {
        BasicBlock::remove((BasicBlock *)local_68,(char *)br);
        std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
                  ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_68);
        this = br;
        (**(code **)(*(long *)local_68._8_8_ + 0x18))();
        BasicBlock::push_back((BasicBlock *)this,&local_70);
        std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_70);
        return true;
      }
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

bool rewriteBrToExit(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* targetBB = br->targetBlock();

      if (targetBB->size() != 1)
        return false;

      if (bb->isAfter(targetBB))
        return false;

      if (RetInstr* ret = dynamic_cast<RetInstr*>(targetBB->getTerminator())) {
        bb->remove(br);
        bb->push_back(ret->clone());

        // FLOW_TRACE("flow: eliminate branch-to-exit block");
        return true;
      }
    }
  }

  return false;
}